

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamMemory.cpp
# Opt level: O0

size_t __thiscall Rml::StreamMemory::Truncate(StreamMemory *this,size_t bytes)

{
  size_t sVar1;
  size_t old_size;
  size_t bytes_local;
  StreamMemory *this_local;
  
  if (this->buffer_used < bytes) {
    this_local = (StreamMemory *)0x0;
  }
  else {
    sVar1 = this->buffer_used;
    this->buffer_used = bytes;
    this->buffer_ptr = this->buffer + bytes;
    this_local = (StreamMemory *)(sVar1 - this->buffer_used);
  }
  return (size_t)this_local;
}

Assistant:

size_t StreamMemory::Truncate(size_t bytes)
{
	if (bytes > buffer_used)
		return 0;

	size_t old_size = buffer_used;
	buffer_used = bytes;
	buffer_ptr = buffer + bytes;
	return old_size - buffer_used;
}